

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
mxx::gather<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_double> *data,size_t size,int root,comm *comm
          )

{
  undefined4 in_register_00000084;
  comm *comm_00;
  
  comm_00 = (comm *)CONCAT44(in_register_00000084,root);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (comm_00->m_rank == (int)size) {
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::resize
              (__return_storage_ptr__,(long)comm_00->m_size * (long)data);
  }
  gather<std::pair<int,double>>
            ((pair<int,_double> *)this,(size_t)data,
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
             _M_impl.super__Vector_impl_data._M_start,(int)size,comm_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    if (comm.rank() == root)
        result.resize(size*comm.size());
    gather(data, size, &result[0], root, comm);
    return result;
}